

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_supported_groups_parse_clienthello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_38 [8];
  CBS supported_group_list;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    supported_group_list.len = (size_t)contents;
    iVar2 = CBS_get_u16_length_prefixed(contents,(CBS *)local_38);
    if ((((iVar2 != 0) && (sVar3 = CBS_len((CBS *)local_38), sVar3 != 0)) &&
        (sVar3 = CBS_len((CBS *)supported_group_list.len), sVar3 == 0)) &&
       (bVar1 = parse_u16_array((CBS *)local_38,&hs->peer_supported_group_list), bVar1)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_supported_groups_parse_clienthello(SSL_HANDSHAKE *hs,
                                                   uint8_t *out_alert,
                                                   CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  CBS supported_group_list;
  if (!CBS_get_u16_length_prefixed(contents, &supported_group_list) ||  //
      CBS_len(&supported_group_list) == 0 ||                            //
      CBS_len(contents) != 0 ||                                         //
      !parse_u16_array(&supported_group_list, &hs->peer_supported_group_list)) {
    return false;
  }

  return true;
}